

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void TestLexicalAnalysis(char *test_file_name)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  void *pvVar6;
  int character_number;
  int line_number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  SymbolName local_488;
  byte local_481;
  SymbolName name;
  bool log_flag;
  Symbol symbol;
  undefined1 local_438 [8];
  LexicalAnalysis lexical_analysis;
  int ret;
  char *test_file_name_local;
  
  lexical_analysis._1052_4_ = 0;
  LexicalAnalysis::LexicalAnalysis((LexicalAnalysis *)local_438,test_file_name);
  bVar1 = LexicalAnalysis::CheckFile((LexicalAnalysis *)local_438);
  if (bVar1) {
    Symbol::Symbol((Symbol *)&name);
    local_481 = 0;
    while( true ) {
      while (lexical_analysis._1052_4_ =
                  LexicalAnalysis::GetSym((LexicalAnalysis *)local_438,(Symbol *)&name),
            lexical_analysis._1052_4_ != 0) {
        iVar3 = Symbol::GetLine((Symbol *)&name);
        iVar4 = Symbol::GetCharacter((Symbol *)&name);
        poVar5 = std::operator<<((ostream *)&std::cerr,"errcode:");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,lexical_analysis._1052_4_);
        poVar5 = std::operator<<(poVar5," in line ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
        poVar5 = std::operator<<(poVar5," in character ");
        pvVar6 = (void *)std::ostream::operator<<(poVar5,iVar4);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      }
      local_488 = Symbol::GetName((Symbol *)&name);
      if (local_488 == EOF_SYM) break;
      if ((local_481 & 1) != 0) {
        if (local_488 == IDENTIFIER_SYM) {
          poVar5 = std::operator<<((ostream *)&std::cout,symbol_name_string[0x22]);
          poVar5 = std::operator<<(poVar5," ");
          Symbol::GetValue<std::__cxx11::string>(&local_4a8,(Symbol *)&name);
          poVar5 = std::operator<<(poVar5,(string *)&local_4a8);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_4a8);
        }
        else if (local_488 == STRING_SYM) {
          poVar5 = std::operator<<((ostream *)&std::cout,symbol_name_string[0x21]);
          poVar5 = std::operator<<(poVar5," ");
          Symbol::GetValue<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &character_number,(Symbol *)&name);
          poVar5 = std::operator<<(poVar5,(string *)&character_number);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&character_number);
        }
        else if (local_488 == CHARACTER_SYM) {
          poVar5 = std::operator<<((ostream *)&std::cout,symbol_name_string[0x20]);
          poVar5 = std::operator<<(poVar5," ");
          cVar2 = Symbol::GetValue<char>((Symbol *)&name);
          poVar5 = std::operator<<(poVar5,cVar2);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else if (local_488 == INTERGER_SYM) {
          poVar5 = std::operator<<((ostream *)&std::cout,symbol_name_string[0x25]);
          poVar5 = std::operator<<(poVar5," ");
          iVar3 = Symbol::GetValue<int>((Symbol *)&name);
          pvVar6 = (void *)std::ostream::operator<<(poVar5,iVar3);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,symbol_name_string[local_488]);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    Symbol::~Symbol((Symbol *)&name);
    symbol.m_line_number = 0;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"bad file");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    symbol.m_line_number = 1;
  }
  LexicalAnalysis::~LexicalAnalysis((LexicalAnalysis *)local_438);
  return;
}

Assistant:

void TestLexicalAnalysis(const char* test_file_name) {
    int ret = COMPILE_OK;
    LexicalAnalysis lexical_analysis(test_file_name);
    if (!lexical_analysis.CheckFile()) {
        std::cerr << "bad file" << endl;
        return;
    }
    Symbol symbol;
    bool log_flag = false;
    while (true) {
        ret = lexical_analysis.GetSym(symbol);
        if (ret == COMPILE_OK) {
            SymbolName name = symbol.GetName();
            if (name == EOF_SYM) {
                break;
            } else if (!log_flag) {
                continue;
            } else if (name == IDENTIFIER_SYM) {
                cout << symbol_name_string[name] << " " << symbol.GetValue<std::string>() << endl;
            } else if (name == STRING_SYM) {
                cout << symbol_name_string[name] << " " << symbol.GetValue<std::string>() << endl;
            } else if (name == CHARACTER_SYM) {
                cout << symbol_name_string[name] << " " << symbol.GetValue<char>() << endl;
            } else if (name == INTERGER_SYM) {
                cout << symbol_name_string[name] << " " << symbol.GetValue<int>() << endl;
            } else {
                cout << symbol_name_string[name] << endl;
            }
        } else {
            int line_number = symbol.GetLine();
            int character_number = symbol.GetCharacter();
            std::cerr << "errcode:" << ret << " in line " << line_number << " in character " << character_number << endl;
        }
    }
}